

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sei.c
# Opt level: O3

MPP_RET process_sei(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *bitctx;
  h264d_cur_ctx_t *phVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  h264_sei_t *sei_msg;
  char *fmt;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  RK_S32 _out;
  BitReadCtx_t payload_bitctx;
  
  phVar1 = currSlice->p_Cur;
  sei_msg = phVar1->sei;
  if (sei_msg == (h264_sei_t *)0x0) {
    sei_msg = (h264_sei_t *)mpp_osal_calloc("process_sei",0xf8);
    currSlice->p_Cur->sei = sei_msg;
  }
  bitctx = &phVar1->bitctx;
  sei_msg->mvc_scalable_nesting_flag = 0;
  sei_msg->p_Dec = currSlice->p_Dec;
  MVar3 = MPP_ERR_UNKNOW;
  do {
    sei_msg->type = 0;
    uVar9 = 0;
    do {
      uVar7 = (phVar1->bitctx).bytes_left_;
      if ((uVar7 < 2) || (0x7fffff00 < (int)uVar9)) {
        fmt = "parse payload_type error: byte_left %d payload_type %d\n";
        goto LAB_001924e4;
      }
      MVar2 = mpp_read_bits(bitctx,8,&_out);
      (phVar1->bitctx).ret = MVar2;
      if (MVar2 != MPP_OK) {
        return MVar3;
      }
      uVar7 = sei_msg->type + _out;
      uVar9 = (ulong)uVar7;
      sei_msg->type = uVar7;
    } while (_out == 0xff);
    sei_msg->payload_size = 0;
    uVar9 = 0;
    do {
      uVar7 = (phVar1->bitctx).bytes_left_;
      if ((int)uVar7 <= (int)uVar9) {
        uVar9 = (ulong)((int)uVar9 + 1);
        goto LAB_001924d6;
      }
      MVar2 = mpp_read_bits(bitctx,8,&_out);
      (phVar1->bitctx).ret = MVar2;
      if (MVar2 != MPP_OK) {
        return MVar3;
      }
      uVar8 = sei_msg->payload_size + _out;
      uVar9 = (ulong)uVar8;
      sei_msg->payload_size = uVar8;
    } while (_out == 0xff);
    uVar7 = (phVar1->bitctx).bytes_left_;
    if ((int)uVar7 < (int)uVar8) {
LAB_001924d6:
      fmt = "parse payload_size error: byte_left %d payload_size %d\n";
LAB_001924e4:
      _mpp_log_l(2,"h264d_sei",fmt,(char *)0x0,(ulong)uVar7,uVar9);
      return MPP_ERR_STREAM;
    }
    if ((h264d_debug._1_1_ & 0x40) != 0) {
      _mpp_log_l(4,"h264d_sei","SEI type %d, payload size: %d\n",(char *)0x0,
                 (ulong)(uint)sei_msg->type);
    }
    payload_bitctx.buf_len = 0;
    payload_bitctx.ret = MPP_OK;
    payload_bitctx.prevention_type = PSEUDO_CODE_NONE;
    payload_bitctx._76_4_ = 0;
    payload_bitctx.used_bits = 0;
    payload_bitctx._52_4_ = 0;
    payload_bitctx.buf = (RK_U8 *)0x0;
    payload_bitctx.prev_two_bytes_ = 0;
    payload_bitctx.emulation_prevention_bytes_ = 0;
    payload_bitctx.curr_byte_ = 0;
    payload_bitctx.num_remaining_bits_in_curr_byte_ = 0;
    payload_bitctx._28_4_ = 0;
    payload_bitctx.data_ = (RK_U8 *)0x0;
    payload_bitctx.bytes_left_ = 0;
    payload_bitctx._12_4_ = 0;
    payload_bitctx.update_curbyte = (_func_MPP_RET_bitread_ctx_t_ptr *)0x0;
    mpp_set_bitread_ctx(&payload_bitctx,bitctx->data_,sei_msg->payload_size);
    mpp_set_bitread_pseudo_code_type(&payload_bitctx,PSEUDO_CODE_H264_H265_SEI);
    switch(sei_msg->type) {
    case 0:
      MVar3 = interpret_buffering_period_info(&payload_bitctx,sei_msg,currSlice->p_Vid);
      if (MVar3 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar3;
        }
        uVar6 = 0x122;
LAB_001925b4:
        _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,uVar6);
        return MVar3;
      }
      break;
    case 1:
      MVar2 = interpret_picture_timing_info(&payload_bitctx,sei_msg,currSlice->p_Vid);
      if (MVar2 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar3;
        }
        uVar6 = 0x125;
        goto LAB_001925b4;
      }
      break;
    default:
      if ((h264d_debug._1_1_ & 0x40) != 0) {
        _mpp_log_l(4,"h264d_sei","Skip parsing SEI type %d\n",(char *)0x0);
      }
      break;
    case 5:
      MVar2 = check_encoder_sei_info
                        (&payload_bitctx,sei_msg->payload_size,&currSlice->p_Vid->deny_flag);
      if (MVar2 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar3;
        }
        uVar6 = 0x128;
        goto LAB_001925b4;
      }
      if ((currSlice->p_Vid->deny_flag != 0) && ((h264d_debug._1_1_ & 0x40) != 0)) {
        _mpp_log_l(4,"h264d_sei","Bitstream is encoded by special encoder.",(char *)0x0);
      }
      break;
    case 6:
      MVar2 = interpret_recovery_point(&payload_bitctx,currSlice->p_Vid);
      if (MVar2 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar3;
        }
        uVar6 = 0x12e;
        goto LAB_001925b4;
      }
    }
    if ((h264d_debug._1_1_ & 0x40) != 0) {
      _mpp_log_l(4,"h264d_sei",
                 "After parsing SEI %d, bits left int cur byte %d, bits_used %d, bytes left %d",
                 (char *)0x0,(ulong)(uint)sei_msg->type,payload_bitctx._24_8_ & 0xffffffff,
                 payload_bitctx._48_8_ & 0xffffffff,payload_bitctx._8_8_ & 0xffffffff);
    }
    if (0 < sei_msg->payload_size) {
      iVar5 = 0;
      do {
        MVar2 = mpp_skip_longbits(bitctx,8);
        (phVar1->bitctx).ret = MVar2;
        if (MVar2 != MPP_OK) {
          return MVar3;
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < sei_msg->payload_size);
    }
    RVar4 = mpp_has_more_rbsp_data(bitctx);
    if (RVar4 == 0) {
      return MPP_OK;
    }
  } while( true );
}

Assistant:

MPP_RET process_sei(H264_SLICE_t *currSlice)
{
    RK_S32  tmp_byte = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SEI_t *sei_msg  = NULL;
    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    BitReadCtx_t payload_bitctx;
    RK_S32 i = 0;

    if (!currSlice->p_Cur->sei)
        currSlice->p_Cur->sei = mpp_calloc(H264_SEI_t, 1);

    sei_msg = currSlice->p_Cur->sei;
    sei_msg->mvc_scalable_nesting_flag = 0;  //init to false
    sei_msg->p_Dec = currSlice->p_Dec;
    do {
        tmp_byte = 0xFF;
        sei_msg->type = 0;
        while (tmp_byte == 0xFF) {
            if (p_bitctx->bytes_left_ < 2 || sei_msg->type > INT_MAX - 255) {
                mpp_err("parse payload_type error: byte_left %d payload_type %d\n",
                        p_bitctx->bytes_left_, sei_msg->type);
                return MPP_ERR_STREAM;
            }

            READ_BITS(p_bitctx, 8, &tmp_byte);
            sei_msg->type += tmp_byte;
        }

        tmp_byte = 0xFF;
        sei_msg->payload_size = 0;
        while (tmp_byte == 0xFF) {
            if ((RK_S32)p_bitctx->bytes_left_ < sei_msg->payload_size + 1) {
                mpp_err("parse payload_size error: byte_left %d payload_size %d\n",
                        p_bitctx->bytes_left_, sei_msg->payload_size + 1);
                return MPP_ERR_STREAM;
            }

            READ_BITS(p_bitctx, 8, &tmp_byte);
            sei_msg->payload_size += tmp_byte;
        }

        if ((RK_S32)p_bitctx->bytes_left_ < sei_msg->payload_size) {
            mpp_err("parse payload_size error: byte_left %d payload_size %d\n",
                    p_bitctx->bytes_left_, sei_msg->payload_size);
            return MPP_ERR_STREAM;
        }

        H264D_DBG(H264D_DBG_SEI, "SEI type %d, payload size: %d\n", sei_msg->type, sei_msg->payload_size);

        memset(&payload_bitctx, 0, sizeof(payload_bitctx));
        mpp_set_bitread_ctx(&payload_bitctx, p_bitctx->data_, sei_msg->payload_size);
        mpp_set_bitread_pseudo_code_type(&payload_bitctx, PSEUDO_CODE_H264_H265_SEI);

        switch (sei_msg->type) {
        case H264_SEI_BUFFERING_PERIOD:
            FUN_CHECK(ret = interpret_buffering_period_info(&payload_bitctx, sei_msg, currSlice->p_Vid));
            break;
        case H264_SEI_PIC_TIMING:
            FUN_CHECK(interpret_picture_timing_info(&payload_bitctx, sei_msg, currSlice->p_Vid));
            break;
        case H264_SEI_USER_DATA_UNREGISTERED:
            FUN_CHECK(check_encoder_sei_info(&payload_bitctx, sei_msg->payload_size, &currSlice->p_Vid->deny_flag));

            if (currSlice->p_Vid->deny_flag)
                H264D_DBG(H264D_DBG_SEI, "Bitstream is encoded by special encoder.");
            break;
        case H264_SEI_RECOVERY_POINT:
            FUN_CHECK(interpret_recovery_point(&payload_bitctx, currSlice->p_Vid));
            break;
        default:
            H264D_DBG(H264D_DBG_SEI, "Skip parsing SEI type %d\n", sei_msg->type);
            break;
        }

        H264D_DBG(H264D_DBG_SEI, "After parsing SEI %d, bits left int cur byte %d, bits_used %d, bytes left %d",
                  sei_msg->type, payload_bitctx.num_remaining_bits_in_curr_byte_, payload_bitctx.used_bits,
                  payload_bitctx.bytes_left_);

        for (i = 0; i < sei_msg->payload_size; i++)
            SKIP_BITS(p_bitctx, 8);
    } while (mpp_has_more_rbsp_data(p_bitctx));    // more_rbsp_data()  msg[offset] != 0x80

    return ret = MPP_OK;
__BITREAD_ERR:
__FAILED:
    return ret;
}